

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O0

_Bool has_property(artifact *art,object *obj,char *prop_name)

{
  _Bool _Var1;
  int iVar2;
  obj_property *poVar3;
  char *pcVar4;
  object_kind *local_c0;
  _Bool *local_b8;
  _Bool *local_b0;
  element_info *local_a8;
  element_info *local_a0;
  bitflag *local_98;
  int16_t *local_90;
  short local_7c;
  short local_7a;
  int16_t standard;
  int16_t bonus;
  object_kind *kind;
  wchar_t pick_1;
  _Bool *s;
  wchar_t pick;
  _Bool *b;
  element_info *el_info_1;
  element_info *el_info;
  bitflag *flags;
  int16_t *modifiers;
  obj_property *prop;
  char *prop_name_local;
  object *obj_local;
  artifact *art_local;
  
  poVar3 = lookup_obj_property_name(prop_name);
  if (poVar3 == (obj_property *)0x0) {
    __assert_fail("prop",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-design.c"
                  ,100,"_Bool has_property(struct artifact *, struct object *, const char *)");
  }
  if ((art == (artifact *)0x0) && (obj == (object *)0x0)) {
    __assert_fail("art || ((art == NULL) && obj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-design.c"
                  ,0x65,"_Bool has_property(struct artifact *, struct object *, const char *)");
  }
  switch(poVar3->type) {
  case L'\x01':
  case L'\x02':
    if (art == (artifact *)0x0) {
      local_90 = obj->modifiers;
    }
    else {
      local_90 = art->modifiers;
    }
    if (local_90[poVar3->index] != 0) {
      return true;
    }
    break;
  case L'\x03':
    if (art == (artifact *)0x0) {
      local_98 = obj->flags;
    }
    else {
      local_98 = art->flags;
    }
    _Var1 = flag_has_dbg(local_98,6,poVar3->index,"flags","prop->index");
    if (_Var1) {
      return true;
    }
    break;
  case L'\x04':
    if (art == (artifact *)0x0) {
      local_a0 = obj->el_info;
    }
    else {
      local_a0 = art->el_info;
    }
    if (local_a0[poVar3->index].res_level != 100) {
      return true;
    }
    break;
  case L'\x05':
    if (art == (artifact *)0x0) {
      local_a8 = obj->el_info;
    }
    else {
      local_a8 = art->el_info;
    }
    if ((local_a8[poVar3->index].flags & 2) != 0) {
      return true;
    }
    break;
  case L'\x06':
    if (art == (artifact *)0x0) {
      local_b0 = obj->brands;
    }
    else {
      local_b0 = art->brands;
    }
    if (local_b0 == (_Bool *)0x0) {
      return false;
    }
    s._4_4_ = 1;
    while ((s._4_4_ < (int)(uint)z_info->brand_max &&
           ((pcVar4 = strstr(poVar3->name,brands[s._4_4_].name), pcVar4 == (char *)0x0 ||
            ((local_b0[s._4_4_] & 1U) == 0))))) {
      s._4_4_ = s._4_4_ + 1;
    }
    if (s._4_4_ < (int)(uint)z_info->brand_max) {
      return true;
    }
    break;
  case L'\a':
    if (art == (artifact *)0x0) {
      local_b8 = obj->slays;
    }
    else {
      local_b8 = art->slays;
    }
    if (local_b8 == (_Bool *)0x0) {
      return false;
    }
    kind._4_4_ = 1;
    while ((kind._4_4_ < (int)(uint)z_info->slay_max &&
           ((pcVar4 = strstr(poVar3->name,slays[kind._4_4_].name), pcVar4 == (char *)0x0 ||
            ((local_b8[kind._4_4_] & 1U) == 0))))) {
      kind._4_4_ = kind._4_4_ + 1;
    }
    if (kind._4_4_ < (int)(uint)z_info->slay_max) {
      return true;
    }
    break;
  case L'\b':
    if (art == (artifact *)0x0) {
      local_c0 = lookup_kind((uint)obj->tval,(uint)obj->sval);
    }
    else {
      local_c0 = lookup_kind(art->tval,art->sval);
    }
    iVar2 = strcmp(poVar3->name,"enhanced dice");
    if (iVar2 == 0) {
      if (art == (artifact *)0x0) {
        if ((local_c0->dd < (int)(uint)obj->dd) || (local_c0->ds < (int)(uint)obj->ds)) {
          return true;
        }
      }
      else if ((local_c0->dd < (int)(uint)art->dd) || (local_c0->ds < (int)(uint)art->ds)) {
        return true;
      }
    }
    else {
      local_7a = 0;
      local_7c = 0;
      iVar2 = strcmp(poVar3->name,"extra armor");
      if (iVar2 == 0) {
        if (art == (artifact *)0x0) {
          local_7a = obj->ac;
        }
        else {
          local_7a = art->ac;
        }
        local_7c = (short)local_c0->ac;
      }
      else {
        iVar2 = strcmp(poVar3->name,"armor bonus");
        if (iVar2 == 0) {
          if (art == (artifact *)0x0) {
            local_7a = obj->to_a;
          }
          else {
            local_7a = art->to_a;
          }
        }
        else {
          iVar2 = strcmp(poVar3->name,"skill bonus");
          if (iVar2 == 0) {
            if (art == (artifact *)0x0) {
              local_7a = obj->to_h;
            }
            else {
              local_7a = art->to_h;
            }
          }
          else {
            iVar2 = strcmp(poVar3->name,"deadliness bonus");
            if (iVar2 == 0) {
              if (art == (artifact *)0x0) {
                local_7a = obj->to_d;
              }
              else {
                local_7a = art->to_d;
              }
            }
          }
        }
      }
      if (local_7a != local_7c) {
        return true;
      }
    }
    break;
  default:
    msg("error -- object property not recognized.");
  }
  return false;
}

Assistant:

static bool has_property(struct artifact *art, struct object *obj,
						 const char *prop_name)
{
	struct obj_property *prop = lookup_obj_property_name(prop_name);
	assert(prop);
	assert(art || ((art == NULL) && obj));

	switch (prop->type) {
		case OBJ_PROPERTY_STAT:
		case OBJ_PROPERTY_MOD:
		{
			int16_t *modifiers = art ? art->modifiers : obj->modifiers;
			if (modifiers[prop->index] != 0) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_FLAG:
		{
			bitflag *flags = art ? art->flags : obj->flags;
			if (of_has(flags, prop->index)) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_ELEMENT:
		{
			struct element_info *el_info = art ? art->el_info : obj->el_info;
			if (el_info[prop->index].res_level != RES_LEVEL_BASE) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_IGNORE:
		{
			struct element_info *el_info = art ? art->el_info : obj->el_info;
			if (el_info[prop->index].flags & EL_INFO_IGNORE) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_BRAND:
		{
			bool *b = art ? art->brands : obj->brands;
			int pick;

			/* See if there are any brands, if so get the correct one */
			if (!b) return false;
			for (pick = 1; pick < z_info->brand_max; pick++) {
				if (strstr(prop->name, brands[pick].name) && b[pick])
					break;
			}

			if (pick < z_info->brand_max) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_SLAY:
		{
			bool *s = art ? art->slays : obj->slays;
			int pick;

			/* See if there are any slays, if so get the correct one */
			if (!s) return false;
			for (pick = 1; pick < z_info->slay_max; pick++) {
				if (strstr(prop->name, slays[pick].name) && s[pick])
					break;
			}

			if (pick < z_info->slay_max) {
				return true;
			}
			break;
		}
		case OBJ_PROPERTY_COMBAT:
		{
			/* Get the object kind to compare */
			struct object_kind *kind = art ? lookup_kind(art->tval, art->sval)
				: lookup_kind(obj->tval, obj->sval);

			/* Enhanced dice require special calculations */
			if (streq(prop->name, "enhanced dice")) {
				if (art) {
					if ((art->dd > kind->dd) || (art->ds > kind->ds)) {
						return true;
					}
				} else if ((obj->dd > kind->dd) || (obj->ds > kind->ds)) {
					return true;
				}
			} else {
				/* Various things get checked to here */
				int16_t bonus = 0, standard = 0;
				if (streq(prop->name, "extra armor")) {
					bonus = art ? art->ac : obj->ac;
					standard = kind->ac;
				} else if (streq(prop->name, "armor bonus")) {
					bonus = art ? art->to_a : obj->to_a;
				} else if (streq(prop->name, "skill bonus")) {
					bonus = art ? art->to_h : obj->to_h;
				} else if (streq(prop->name, "deadliness bonus")) {
					bonus = art ? art->to_d : obj->to_d;
				}
				if (bonus != standard) {
					return true;
				}
			}
			break;
		}

		default: msg("error -- object property not recognized."); break;
	}

	return false;
}